

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O1

void __thiscall
t_rs_generator::render_list_sync_read(t_rs_generator *this,t_list *tlist,string *list_var)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  t_type *ttype;
  ostream *poVar4;
  string list_elem_var;
  string local_90;
  string local_70;
  string local_50;
  
  ttype = tlist->elem_type_;
  poVar1 = &this->f_gen_;
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"let list_ident = i_prot.read_list_begin()?;",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"let mut ",8);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(list_var->_M_dataplus)._M_p,list_var->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
  to_rust_type_abi_cxx11_(&local_70,this,(t_type *)tlist);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4," = Vec::with_capacity(list_ident.size as usize);",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  paVar3 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"for _ in 0..list_ident.size {",0x1d);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"list_elem_","");
  t_generator::tmp(&local_90,&this->super_t_generator,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  render_type_sync_read(this,&local_90,ttype,false);
  t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_70._M_dataplus._M_p,local_70._M_string_length);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(list_var->_M_dataplus)._M_p,list_var->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,".push(",6);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"i_prot.read_list_end()?;",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar3) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_rs_generator::render_list_sync_read(t_list *tlist, const string &list_var) {
  t_type* elem_type = tlist->get_elem_type();

  f_gen_ << indent() << "let list_ident = i_prot.read_list_begin()?;" << endl;
  f_gen_
    << indent()
    << "let mut " << list_var << ": " << to_rust_type((t_type*) tlist)
    << " = Vec::with_capacity(list_ident.size as usize);"
    << endl;
  f_gen_ << indent() << "for _ in 0..list_ident.size {" << endl;

  indent_up();

  string list_elem_var = tmp("list_elem_");
  render_type_sync_read(list_elem_var, elem_type);
  f_gen_ << indent() << list_var << ".push(" << list_elem_var << ");" << endl;

  indent_down();

  f_gen_ << indent() << "}" << endl;
  f_gen_ << indent() << "i_prot.read_list_end()?;" << endl;
}